

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.hpp
# Opt level: O0

void __thiscall
fidler::ast::
OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
::OperatorExpression
          (OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
           *this,OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
                 *param_1)

{
  OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
  *param_1_local;
  OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>
  *this_local;
  
  OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>::
  OperatorExpression(&this->left,&param_1->left);
  std::
  vector<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>,_std::allocator<std::pair<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_>_>
  ::vector(&this->right,&param_1->right);
  return;
}

Assistant:

OperatorExpression(OperatorExpression&&) = default;